

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall DBOPL::Operator::Write80(Operator *this,Chip *chip,Bit8u val)

{
  byte bVar1;
  byte bVar2;
  Bit8u sustain;
  Bit8u change;
  Bit8u val_local;
  Chip *chip_local;
  Operator *this_local;
  
  bVar1 = this->reg80 ^ val;
  if (bVar1 != 0) {
    this->reg80 = val;
    bVar2 = (byte)((int)(uint)val >> 4);
    this->sustainLevel = (uint)(bVar2 | bVar2 + 1 & 0x10) << 4;
    if ((bVar1 & 0xf) != 0) {
      UpdateRelease(this,chip);
    }
  }
  return;
}

Assistant:

void Operator::Write80( const Chip* chip, Bit8u val ) {
	Bit8u change = (reg80 ^ val );
	if ( !change )
		return;
	reg80 = val;
	Bit8u sustain = val >> 4;
	//Turn 0xf into 0x1f
	sustain |= ( sustain + 1) & 0x10;
	sustainLevel = sustain << ( ENV_BITS - 5 );
	if ( change & 0x0f ) {
		UpdateRelease( chip );
	}
}